

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::resetFlowAndLoss(Graph *this)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  
  for (pVVar1 = this->verticesList; pVVar1 != (Vertex *)0x0; pVVar1 = pVVar1->nextVertex) {
    for (pEVar2 = pVVar1->edgesList; pEVar2 != (Edge *)0x0; pEVar2 = pEVar2->nextEdge) {
      pEVar2->activePowerFlow = 0.0;
      pEVar2->reactivePowerFlow = 0.0;
      pEVar2->activeLoss = 0.0;
      pEVar2->reactiveLoss = 0.0;
    }
  }
  return;
}

Assistant:

void Graph::resetFlowAndLoss(){
    for(Vertex *v=this->verticesList; v!=NULL; v= v->getNext()){
        for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){
            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);
        }
    }
}